

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  GetPastPresentationTimingGOOGLEFunc vkp_;
  undefined8 programBinaries_;
  bool bVar1;
  deUint32 dVar2;
  VkAllocationCallbacks *pVVar3;
  PlatformInterface *pPVar4;
  DeviceInterface *pDVar5;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries__00;
  TestContext *pTVar6;
  CommandLine *this;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  deUint32 local_d78;
  allocator<char> local_d29;
  string local_d28;
  allocator<char> local_d01;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  MessageBuilder local_c90;
  allocator<char> local_b09;
  string local_b08;
  int local_ae8;
  OutOfMemoryError *e;
  RefData<vk::Handle<(vk::HandleType)13>_> local_a98;
  undefined1 local_a78 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> obj;
  MessageBuilder local_a50;
  byte local_8c9;
  undefined1 local_8c8 [7];
  bool createOk;
  Environment objEnv;
  AllocationCallbackRecorder recorder;
  DeterministicFailAllocator objAllocator;
  Resources res;
  undefined1 local_788 [8];
  EnvClone resEnv;
  deUint32 maxTries;
  deUint32 cmdLineIterCount;
  deUint32 numPassingAllocs;
  undefined1 local_b0 [8];
  Environment rootEnv;
  AllocationCallbackRecorder resCallbacks;
  Context *context_local;
  
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,pVVar3,0x80);
  pPVar4 = Context::getPlatformInterface(context);
  pDVar5 = Context::getDeviceInterface(context);
  device_ = Context::getDevice(context);
  dVar2 = Context::getUniversalQueueFamilyIndex(context);
  programBinaries__00 = Context::getBinaryCollection(context);
  pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&rootEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)local_b0,pPVar4,pDVar5,device_,dVar2,programBinaries__00,pVVar3,1);
  maxTries = 0;
  pTVar6 = Context::getTestContext(context);
  this = tcu::TestContext::getCommandLine(pTVar6);
  local_d78 = tcu::CommandLine::getTestIterationCount(this);
  resEnv.env._52_4_ = local_d78;
  if (local_d78 == 0) {
    local_d78 = getOomIterLimit<vkt::api::(anonymous_namespace)::ImageView>();
  }
  resEnv.env.maxResourceConsumers = local_d78;
  res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)getDefaulDeviceParameters(context);
  EnvClone::EnvClone((EnvClone *)local_788,(Environment *)local_b0,
                     (Parameters *)
                     &res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter
                      .m_allocator,1);
  ImageView::Resources::Resources
            ((Resources *)&objAllocator.m_allocationNdx,
             (Environment *)&resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,&params);
  do {
    if (resEnv.env.maxResourceConsumers <= maxTries) {
LAB_007f5cef:
      local_ae8 = 0;
LAB_007f5cf9:
      ImageView::Resources::~Resources((Resources *)&objAllocator.m_allocationNdx);
      EnvClone::~EnvClone((EnvClone *)local_788);
      if (local_ae8 == 0) {
        pTVar6 = Context::getTestContext(context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        bVar1 = ::vk::validateAndLog
                          (pTVar7,(AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,0);
        if (bVar1) {
          if (maxTries == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_cd8,"Allocation callbacks not called",&local_cd9);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_cd8);
            std::__cxx11::string::~string((string *)&local_cd8);
            std::allocator<char>::~allocator(&local_cd9);
            local_ae8 = 1;
          }
          else if (maxTries == resEnv.env.maxResourceConsumers) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d00,"Max iter count reached; OOM testing incomplete",
                       &local_d01);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_COMPATIBILITY_WARNING,&local_d00);
            std::__cxx11::string::~string((string *)&local_d00);
            std::allocator<char>::~allocator(&local_d01);
            local_ae8 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"Ok",&local_d29)
            ;
            tcu::TestStatus::pass(__return_storage_ptr__,&local_d28);
            std::__cxx11::string::~string((string *)&local_d28);
            std::allocator<char>::~allocator(&local_d29);
            local_ae8 = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_cb0,"Invalid allocation callback",&local_cb1);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_cb0);
          std::__cxx11::string::~string((string *)&local_cb0);
          std::allocator<char>::~allocator(&local_cb1);
          local_ae8 = 1;
        }
      }
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
                ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers);
      return __return_storage_ptr__;
    }
    pVVar3 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,pVVar3,MODE_COUNT_AND_FAIL,
               maxTries);
    pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&recorder.m_records.m_last);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar3,0x80);
    programBinaries_ = resEnv.env._24_8_;
    dVar2 = (deUint32)resEnv.env.device;
    pDVar5 = resEnv.env.vkd;
    pPVar4 = resEnv.env.vkp;
    vkp_ = resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE;
    pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
    Environment::Environment
              ((Environment *)local_8c8,(PlatformInterface *)vkp_,(DeviceInterface *)pPVar4,
               (VkDevice)pDVar5,dVar2,(BinaryCollection *)programBinaries_,pVVar3,
               (deUint32)resEnv.env.allocationCallbacks);
    local_8c9 = 0;
    pTVar6 = Context::getTestContext(context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<(&local_a50,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_a50,(char (*) [30])"Trying to create object with ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&maxTries);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])" allocation");
    obj.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x12f6f83;
    if (maxTries != 1) {
      obj.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x13bf3a6;
    }
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(char **)&obj.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                                         deleter.m_allocator);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])" passing");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a50);
    ImageView::create((Move<vk::Handle<(vk::HandleType)13>_> *)&e,(Environment *)local_8c8,
                      (Resources *)&objAllocator.m_allocationNdx,&params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_a98,(Move *)&e);
    data.deleter.m_deviceIface._0_4_ = (int)local_a98.deleter.m_deviceIface;
    data.object.m_internal = local_a98.object.m_internal;
    data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a98.deleter.m_deviceIface >> 0x20);
    data.deleter.m_device = local_a98.deleter.m_device;
    data.deleter.m_allocator = local_a98.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_a78,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)13>_> *)&e);
    local_8c9 = 1;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_a78);
    pTVar6 = Context::getTestContext(context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    bVar1 = ::vk::validateAndLog
                      (pTVar7,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
    if (bVar1) {
      if ((local_8c9 & 1) == 0) {
        local_ae8 = 0;
      }
      else {
        pTVar6 = Context::getTestContext(context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<(&local_c90,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_c90,(char (*) [32])"Object construction succeeded! ");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_c90);
        local_ae8 = 2;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b08,"Invalid allocation callback",&local_b09);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_b08);
      std::__cxx11::string::~string((string *)&local_b08);
      std::allocator<char>::~allocator(&local_b09);
      local_ae8 = 1;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last);
    if (local_ae8 != 0) {
      if (local_ae8 != 2) goto LAB_007f5cf9;
      goto LAB_007f5cef;
    }
    maxTries = maxTries + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}